

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_swrenderer.cpp
# Opt level: O2

void __thiscall FSoftwareRenderer::ErrorCleanup(FSoftwareRenderer *this)

{
  fakeActive = 0;
  fake3D = 0;
  while (CurrentSkybox != 0) {
    R_3D_DeleteHeights();
    R_3D_LeaveSkybox();
  }
  R_3D_ResetClip();
  R_3D_DeleteHeights();
  return;
}

Assistant:

void FSoftwareRenderer::ErrorCleanup ()
{
	fakeActive = 0;
	fake3D = 0;
	while (CurrentSkybox)
	{
		R_3D_DeleteHeights();
		R_3D_LeaveSkybox();
	}
	R_3D_ResetClip();
	R_3D_DeleteHeights();
}